

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void setSectorSize(Pager *pPager)

{
  sqlite3_io_methods *psVar1;
  _func_int_sqlite3_file_ptr *p_Var2;
  uint uVar3;
  u32 uVar4;
  u32 uVar5;
  u32 uVar6;
  
  uVar6 = 0x200;
  if (pPager->tempFile == '\0') {
    psVar1 = pPager->fd->pMethods;
    if (psVar1 != (sqlite3_io_methods *)0x0) {
      uVar3 = (*psVar1->xDeviceCharacteristics)(pPager->fd);
      if ((uVar3 >> 0xc & 1) != 0) goto LAB_001490c2;
    }
    p_Var2 = pPager->fd->pMethods->xSectorSize;
    if (p_Var2 == (_func_int_sqlite3_file_ptr *)0x0) {
      uVar4 = 0x1000;
    }
    else {
      uVar4 = (*p_Var2)(pPager->fd);
    }
    uVar5 = 0x10000;
    if ((int)uVar4 < 0x10000) {
      uVar5 = uVar4;
    }
    uVar6 = 0x200;
    if (0x1f < (int)uVar4) {
      uVar6 = uVar5;
    }
  }
LAB_001490c2:
  pPager->sectorSize = uVar6;
  return;
}

Assistant:

static void setSectorSize(Pager *pPager){
  assert( isOpen(pPager->fd) || pPager->tempFile );

  if( pPager->tempFile
   || (sqlite3OsDeviceCharacteristics(pPager->fd) &
              SQLITE_IOCAP_POWERSAFE_OVERWRITE)!=0
  ){
    /* Sector size doesn't matter for temporary files. Also, the file
    ** may not have been opened yet, in which case the OsSectorSize()
    ** call will segfault. */
    pPager->sectorSize = 512;
  }else{
    pPager->sectorSize = sqlite3SectorSize(pPager->fd);
  }
}